

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::ValidateSymbolName
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  byte bVar1;
  int i;
  ulong uVar2;
  
  for (uVar2 = 0; name->_M_string_length != uVar2; uVar2 = uVar2 + 1) {
    bVar1 = (name->_M_dataplus)._M_p[uVar2];
    if (((bVar1 != 0x2e) && (bVar1 != 0x5f)) &&
       (((char)bVar1 < '0' ||
        ((0x39 < bVar1 && ((bVar1 < 0x41 || (0x5a < bVar1 && (byte)(bVar1 + 0x85) < 0xe6))))))))
    break;
  }
  return name->_M_string_length <= uVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::ValidateSymbolName(
    const string& name) {
  for (int i = 0; i < name.size(); i++) {
    // I don't trust ctype.h due to locales.  :(
    if (name[i] != '.' && name[i] != '_' &&
        (name[i] < '0' || name[i] > '9') &&
        (name[i] < 'A' || name[i] > 'Z') &&
        (name[i] < 'a' || name[i] > 'z')) {
      return false;
    }
  }
  return true;
}